

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

mbedtls_ecp_curve_info * mbedtls_ecp_curve_info_from_tls_id(uint16_t tls_id)

{
  mbedtls_ecp_curve_info *pmVar1;
  
  pmVar1 = ecp_supported_curves;
  while( true ) {
    if (pmVar1->grp_id == MBEDTLS_ECP_DP_NONE) {
      return (mbedtls_ecp_curve_info *)0x0;
    }
    if (pmVar1->tls_id == tls_id) break;
    pmVar1 = pmVar1 + 1;
  }
  return pmVar1;
}

Assistant:

const mbedtls_ecp_curve_info *mbedtls_ecp_curve_info_from_tls_id( uint16_t tls_id )
{
    const mbedtls_ecp_curve_info *curve_info;

    for( curve_info = mbedtls_ecp_curve_list();
         curve_info->grp_id != MBEDTLS_ECP_DP_NONE;
         curve_info++ )
    {
        if( curve_info->tls_id == tls_id )
            return( curve_info );
    }

    return( NULL );
}